

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void process_op_defs(TCGContext_conflict9 *s)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  TCGOpDef *def_00;
  TCGTargetOpDef *pTVar4;
  char *pcStack_40;
  int oarg;
  char *ct_str;
  int local_30;
  int nb_args;
  int i;
  TCGType_conflict type;
  TCGTargetOpDef *tdefs;
  TCGOpDef *def;
  TCGOpcode op;
  TCGContext_conflict9 *s_local;
  
  for (def._4_4_ = INDEX_op_discard; def._4_4_ < NB_OPS; def._4_4_ = def._4_4_ + INDEX_op_set_label)
  {
    def_00 = s->tcg_op_defs + def._4_4_;
    if (((def_00->flags & 0x20) == 0) &&
       (iVar2 = (uint)def_00->nb_iargs + (uint)def_00->nb_oargs, iVar2 != 0)) {
      pTVar4 = tcg_target_op_def(def._4_4_);
      bVar1 = def_00->flags;
      for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
        pcStack_40 = pTVar4->args_ct_str[local_30];
        def_00->args_ct[local_30].u.regs = 0;
        def_00->args_ct[local_30].ct = 0;
        while (*pcStack_40 != '\0') {
          iVar3 = (int)*pcStack_40;
          if (iVar3 == 0x26) {
            def_00->args_ct[local_30].ct = def_00->args_ct[local_30].ct | 0x20;
            pcStack_40 = pcStack_40 + 1;
          }
          else if (iVar3 - 0x30U < 10) {
            iVar3 = *pcStack_40 + -0x30;
            def_00->args_ct[local_30] = def_00->args_ct[iVar3];
            def_00->args_ct[iVar3].ct = def_00->args_ct[iVar3].ct | 0x80;
            def_00->args_ct[iVar3].alias_index = (uint8_t)local_30;
            def_00->args_ct[local_30].ct = def_00->args_ct[local_30].ct | 0x40;
            def_00->args_ct[local_30].alias_index = (uint8_t)iVar3;
            pcStack_40 = pcStack_40 + 1;
          }
          else if (iVar3 == 0x69) {
            def_00->args_ct[local_30].ct = def_00->args_ct[local_30].ct | 2;
            pcStack_40 = pcStack_40 + 1;
          }
          else {
            pcStack_40 = target_parse_constraint
                                   (def_00->args_ct + local_30,pcStack_40,
                                    (uint)((bVar1 & 0x10) != 0));
          }
        }
      }
      sort_constraints(def_00,0,(uint)def_00->nb_oargs);
      sort_constraints(def_00,(uint)def_00->nb_oargs,(uint)def_00->nb_iargs);
    }
  }
  return;
}

Assistant:

static void process_op_defs(TCGContext *s)
{
    TCGOpcode op;

    for (op = 0; op < NB_OPS; op++) {
        TCGOpDef *def = &s->tcg_op_defs[op];
        const TCGTargetOpDef *tdefs;
        TCGType type;
        int i, nb_args;

        if (def->flags & TCG_OPF_NOT_PRESENT) {
            continue;
        }

        nb_args = def->nb_iargs + def->nb_oargs;
        if (nb_args == 0) {
            continue;
        }

        tdefs = tcg_target_op_def(op);
        /* Missing TCGTargetOpDef entry. */
        tcg_debug_assert(tdefs != NULL);

        type = (def->flags & TCG_OPF_64BIT ? TCG_TYPE_I64 : TCG_TYPE_I32);
        for (i = 0; i < nb_args; i++) {
            const char *ct_str = tdefs->args_ct_str[i];
            /* Incomplete TCGTargetOpDef entry. */
            tcg_debug_assert(ct_str != NULL);

            def->args_ct[i].u.regs = 0;
            def->args_ct[i].ct = 0;
            while (*ct_str != '\0') {
                switch(*ct_str) {
                case '0':
                case '1':
                case '2':
                case '3':
                case '4':
                case '5':
                case '6':
                case '7':
                case '8':
                case '9':
                    {
                        int oarg = *ct_str - '0';
                        tcg_debug_assert(ct_str == tdefs->args_ct_str[i]);
                        tcg_debug_assert(oarg < def->nb_oargs);
                        tcg_debug_assert(def->args_ct[oarg].ct & TCG_CT_REG);
                        /* TCG_CT_ALIAS is for the output arguments.
                           The input is tagged with TCG_CT_IALIAS. */
                        def->args_ct[i] = def->args_ct[oarg];
                        def->args_ct[oarg].ct |= TCG_CT_ALIAS;
                        def->args_ct[oarg].alias_index = i;
                        def->args_ct[i].ct |= TCG_CT_IALIAS;
                        def->args_ct[i].alias_index = oarg;
                    }
                    ct_str++;
                    break;
                case '&':
                    def->args_ct[i].ct |= TCG_CT_NEWREG;
                    ct_str++;
                    break;
                case 'i':
                    def->args_ct[i].ct |= TCG_CT_CONST;
                    ct_str++;
                    break;
                default:
                    ct_str = target_parse_constraint(&def->args_ct[i],
                                                     ct_str, type);
                    /* Typo in TCGTargetOpDef constraint. */
                    tcg_debug_assert(ct_str != NULL);
                }
            }
        }

        /* TCGTargetOpDef entry with too much information? */
        tcg_debug_assert(i == TCG_MAX_OP_ARGS || tdefs->args_ct_str[i] == NULL);

        /* sort the constraints (XXX: this is just an heuristic) */
        sort_constraints(def, 0, def->nb_oargs);
        sort_constraints(def, def->nb_oargs, def->nb_iargs);
    }
}